

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

JSONNode __thiscall JSONNode::pop_back(JSONNode *this,json_index_t pos)

{
  size_t *psVar1;
  internalJSONNode *piVar2;
  json_index_t jVar3;
  JSONNode *pJVar4;
  out_of_range *this_00;
  string *psVar5;
  json_index_t in_EDX;
  undefined4 in_register_00000034;
  
  pJVar4 = (JSONNode *)CONCAT44(in_register_00000034,pos);
  jVar3 = internalJSONNode::size(pJVar4->internal);
  if (in_EDX < jVar3) {
    makeUniqueInternal(pJVar4);
    pJVar4 = internalJSONNode::pop_back(pJVar4->internal,in_EDX);
    piVar2 = pJVar4->internal;
    psVar1 = &piVar2->refcount;
    *psVar1 = *psVar1 + 1;
    this->internal = piVar2;
    deleteJSONNode(pJVar4);
    return (JSONNode)(internalJSONNode *)this;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  psVar5 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::out_of_range::out_of_range(this_00,(string *)psVar5);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

json_throws(std::out_of_range) {
    JSON_CHECK_INTERNAL();
    if (json_unlikely(pos >= internal -> size())){
	   JSON_FAIL(JSON_TEXT("pop_back out of bounds"));
	   json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
    }
    makeUniqueInternal();
    #ifdef JSON_LIBRARY
	   return internal -> pop_back(pos);
    #else
	   auto_delete temp(internal -> pop_back(pos));
	   return *temp.mynode;
    #endif
}